

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateArrayIndex(ExpressionContext *ctx,SynBase *source,ExprBase *value,
                ArrayView<ArgumentData> arguments)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ExprTypeLiteral *pEVar8;
  TypeArgumentSet *pTVar9;
  ArgumentData *pAVar10;
  ExprBase *pEVar11;
  ExprIntegerLiteral *pEVar12;
  TypeHandle *pTVar13;
  TypeRef *pTVar14;
  ExprVariableAccess *pEVar15;
  VariableHandle *pVVar16;
  TypeBase *pTVar17;
  ExprError *this;
  TypeBase *type_00;
  SynBase *source_00;
  VariableData *variable;
  ExprVariableDefinition *this_00;
  ExprDereference *pEVar18;
  ExprBase *node_00;
  TypeArray *pTVar19;
  ExprArrayIndex *pEVar20;
  TypeUnsizedArray *pTVar21;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  TypeBase *local_3a0;
  bool local_389;
  ExprArrayIndex *shift_1;
  TypeUnsizedArray *type_2;
  ExprArrayIndex *shift;
  TypeArray *type_1;
  ExprIntegerLiteral *indexValue;
  ExprBase *index;
  TypeRef *refType_2;
  undefined4 local_248;
  InplaceStr local_240;
  ExprBase *local_230;
  ExprBase *result_1;
  bool bStack_220;
  undefined7 uStack_21f;
  SynIdentifier *local_218;
  TypeBase *pTStack_210;
  ExprBase *local_208;
  FunctionData *pFStack_200;
  int local_1f4;
  TypeRef *local_1f0;
  TypeRef *refType_1;
  undefined4 local_1e0;
  InplaceStr local_1d8;
  ExprBase *local_1c8;
  ExprBase *result;
  uint i_1;
  ArgumentData local_1b0;
  undefined1 local_180 [8];
  SmallArray<ArgumentData,_4U> callArguments;
  TypePair typePair;
  uint i;
  bool findOverload;
  ExprBase *definition;
  ExprBase *assignment;
  VariableData *storage;
  SynBase *sourceInternal;
  ExprDereference *node_1;
  ExprVariableAccess *node;
  TypeRef *refType;
  ExprBase *wrapped;
  ExprIntegerLiteral *number;
  TypeArgumentSet *argumentSet;
  ExprTypeLiteral *type;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<ArgumentData> arguments_local;
  
  ctx_local = (ExpressionContext *)arguments.data;
  arguments_local.data._0_4_ = arguments.count;
  pEVar8 = getType<ExprTypeLiteral>(value);
  if (((pEVar8 != (ExprTypeLiteral *)0x0) &&
      (pTVar9 = getType<TypeArgumentSet>(pEVar8->value), pTVar9 != (TypeArgumentSet *)0x0)) &&
     (uVar6 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local), uVar6 == 1)) {
    pAVar10 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,0);
    pEVar11 = anon_unknown.dwarf_6f1cc::EvaluateExpression(ctx,source,pAVar10->value);
    pEVar12 = getType<ExprIntegerLiteral>(pEVar11);
    if (pEVar12 != (ExprIntegerLiteral *)0x0) {
      if (pEVar12->value < 0) {
        anon_unknown.dwarf_6f1cc::Stop(ctx,source,"ERROR: argument index can\'t be negative");
      }
      bVar5 = IntrusiveList<TypeHandle>::empty(&pTVar9->types);
      if (bVar5) {
        anon_unknown.dwarf_6f1cc::Stop(ctx,source,"ERROR: function argument set is empty");
      }
      lVar1 = pEVar12->value;
      uVar6 = IntrusiveList<TypeHandle>::size(&pTVar9->types);
      if ((long)(ulong)uVar6 <= lVar1) {
        pcVar2 = (pTVar9->super_TypeBase).name.end;
        pcVar3 = (pTVar9->super_TypeBase).name.begin;
        pcVar4 = (pTVar9->super_TypeBase).name.begin;
        uVar6 = IntrusiveList<TypeHandle>::size(&pTVar9->types);
        anon_unknown.dwarf_6f1cc::Stop
                  (ctx,source,"ERROR: function arguemnt set \'%.*s\' has only %d argument(s)",
                   (ulong)(uint)((int)pcVar2 - (int)pcVar3),pcVar4,(ulong)uVar6);
      }
      pEVar8 = ExpressionContext::get<ExprTypeLiteral>(ctx);
      pTVar17 = ctx->typeTypeID;
      pTVar13 = IntrusiveList<TypeHandle>::operator[](&pTVar9->types,(uint)pEVar12->value);
      ExprTypeLiteral::ExprTypeLiteral(pEVar8,source,pTVar17,pTVar13->type);
      return &pEVar8->super_ExprBase;
    }
    anon_unknown.dwarf_6f1cc::Stop
              (ctx,source,"ERROR: expression didn\'t evaluate to a constant number");
  }
  pTVar14 = getType<TypeRef>(value->type);
  if (pTVar14 == (TypeRef *)0x0) {
    bVar5 = isType<TypeUnsizedArray>(value->type);
    refType = (TypeRef *)value;
    type = (ExprTypeLiteral *)value;
    if (!bVar5) {
      pEVar15 = getType<ExprVariableAccess>(value);
      if (pEVar15 == (ExprVariableAccess *)0x0) {
        pEVar18 = getType<ExprDereference>(value);
        if (pEVar18 == (ExprDereference *)0x0) {
          bVar5 = isType<TypeRef>(value->type);
          refType = (TypeRef *)value;
          if (!bVar5) {
            bVar5 = AssertValueExpression(ctx,source,value);
            if (!bVar5) {
              pEVar20 = ExpressionContext::get<ExprArrayIndex>(ctx);
              pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
              this = ExpressionContext::get<ExprError>(ctx);
              type_00 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
              ExprError::ExprError(this,source,type_00);
              ExprArrayIndex::ExprArrayIndex(pEVar20,source,pTVar17,value,&this->super_ExprBase);
              return &pEVar20->super_ExprBase;
            }
            source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
            variable = anon_unknown.dwarf_6f1cc::AllocateTemporary(ctx,source_00,value->type);
            pEVar11 = CreateVariableAccess(ctx,source_00,variable,false);
            pEVar11 = CreateAssignment(ctx,source_00,pEVar11,value);
            this_00 = ExpressionContext::get<ExprVariableDefinition>(ctx);
            pTVar17 = ctx->typeVoid;
            pVVar16 = ExpressionContext::get<VariableHandle>(ctx);
            VariableHandle::VariableHandle(pVVar16,(SynBase *)0x0,variable);
            ExprVariableDefinition::ExprVariableDefinition
                      (this_00,source_00,pTVar17,pVVar16,pEVar11);
            pEVar11 = CreateVariableAccess(ctx,source_00,variable,false);
            pEVar11 = CreateGetAddress(ctx,source_00,pEVar11);
            refType = (TypeRef *)CreateSequence(ctx,source,&this_00->super_ExprBase,pEVar11);
          }
        }
        else {
          refType = (TypeRef *)pEVar18->value;
        }
      }
      else {
        refType = (TypeRef *)ExpressionContext::get<ExprGetAddress>(ctx);
        pTVar14 = ExpressionContext::GetReferenceType(ctx,value->type);
        pVVar16 = ExpressionContext::get<VariableHandle>(ctx);
        VariableHandle::VariableHandle(pVVar16,(pEVar15->super_ExprBase).source,pEVar15->variable);
        ExprGetAddress::ExprGetAddress
                  ((ExprGetAddress *)refType,source,&pTVar14->super_TypeBase,pVVar16);
      }
    }
  }
  else {
    type = (ExprTypeLiteral *)ExpressionContext::get<ExprDereference>(ctx);
    ExprDereference::ExprDereference((ExprDereference *)type,source,pTVar14->subType,value);
    bVar5 = isType<TypeUnsizedArray>((TypeBase *)(((TypeRef *)type)->super_TypeBase).name.end);
    refType = (TypeRef *)type;
    if (!bVar5) {
      refType = (TypeRef *)value;
    }
  }
  bVar5 = isType<TypeRef>((TypeBase *)(refType->super_TypeBase).name.end);
  if ((bVar5) || (bVar5 = isType<TypeUnsizedArray>((type->super_ExprBase).type), bVar5)) {
    bVar5 = ArrayView<ArgumentData>::empty((ArrayView<ArgumentData> *)&ctx_local);
    local_389 = true;
    if (!bVar5) {
      uVar6 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
      local_389 = 1 < uVar6;
    }
    for (typePair.b._0_4_ = 0;
        uVar6 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local),
        (uint)typePair.b < uVar6; typePair.b._0_4_ = (uint)typePair.b + 1) {
      pAVar10 = ArrayView<ArgumentData>::operator[]
                          ((ArrayView<ArgumentData> *)&ctx_local,(uint)typePair.b);
      if (pAVar10->name != (SynIdentifier *)0x0) {
        local_389 = true;
      }
    }
    pTVar17 = (TypeBase *)(refType->super_TypeBase).name.end;
    bVar5 = ArrayView<ArgumentData>::empty((ArrayView<ArgumentData> *)&ctx_local);
    if (bVar5) {
      local_3a0 = (TypeBase *)0x0;
    }
    else {
      pAVar10 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,0);
      local_3a0 = pAVar10->type;
    }
    TypePair::TypePair((TypePair *)&callArguments.allocator,pTVar17,local_3a0);
    if ((local_389 != false) ||
       (bVar5 = SmallDenseSet<TypePair,_TypePairHasher,_32U>::contains
                          (&ctx->noIndexOperatorForTypePair,(TypePair *)&callArguments.allocator),
       !bVar5)) {
      SmallArray<ArgumentData,_4U>::SmallArray
                ((SmallArray<ArgumentData,_4U> *)local_180,ctx->allocator);
      ArgumentData::ArgumentData
                (&local_1b0,(SynBase *)(refType->super_TypeBase).name.begin,false,
                 (SynIdentifier *)0x0,(TypeBase *)(refType->super_TypeBase).name.end,
                 (ExprBase *)refType);
      SmallArray<ArgumentData,_4U>::push_back((SmallArray<ArgumentData,_4U> *)local_180,&local_1b0);
      for (result._0_4_ = 0; uVar6 = (uint)result,
          uVar7 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local),
          uVar6 < uVar7; result._0_4_ = (uint)result + 1) {
        pAVar10 = ArrayView<ArgumentData>::operator[]
                            ((ArrayView<ArgumentData> *)&ctx_local,(uint)result);
        SmallArray<ArgumentData,_4U>::push_back((SmallArray<ArgumentData,_4U> *)local_180,pAVar10);
      }
      InplaceStr::InplaceStr(&local_1d8,"[]");
      ArrayView<ArgumentData>::ArrayView<4u>
                ((ArrayView<ArgumentData> *)&refType_1,(SmallArray<ArgumentData,_4U> *)local_180);
      arguments_00._12_4_ = 0;
      arguments_00.data = (ArgumentData *)refType_1;
      arguments_00.count = local_1e0;
      local_1c8 = CreateFunctionCallByName(ctx,source,local_1d8,arguments_00,true,false,true);
      if (local_1c8 == (ExprBase *)0x0) {
        ArgumentData::ArgumentData
                  ((ArgumentData *)&result_1,(type->super_ExprBase).source,false,
                   (SynIdentifier *)0x0,(type->super_ExprBase).type,&type->super_ExprBase);
        pAVar10 = SmallArray<ArgumentData,_4U>::operator[]
                            ((SmallArray<ArgumentData,_4U> *)local_180,0);
        pAVar10->value = local_208;
        pAVar10->valueFunction = pFStack_200;
        pAVar10->name = local_218;
        pAVar10->type = pTStack_210;
        pAVar10->source = (SynBase *)result_1;
        pAVar10->isExplicit = bStack_220;
        *(undefined7 *)&pAVar10->field_0x9 = uStack_21f;
        InplaceStr::InplaceStr(&local_240,"[]");
        ArrayView<ArgumentData>::ArrayView<4u>
                  ((ArrayView<ArgumentData> *)&refType_2,(SmallArray<ArgumentData,_4U> *)local_180);
        arguments_01._12_4_ = 0;
        arguments_01.data = (ArgumentData *)refType_2;
        arguments_01.count = local_248;
        local_230 = CreateFunctionCallByName
                              (ctx,source,local_240,arguments_01,(bool)~local_389,false,true);
        if (local_230 == (ExprBase *)0x0) {
          SmallDenseSet<TypePair,_TypePairHasher,_32U>::insert
                    (&ctx->noIndexOperatorForTypePair,(TypePair *)&callArguments.allocator);
          local_1f4 = 0;
        }
        else {
          pTVar14 = getType<TypeRef>(local_230->type);
          if (pTVar14 == (TypeRef *)0x0) {
            arguments_local._8_8_ = local_230;
            local_1f4 = 1;
          }
          else {
            pEVar18 = ExpressionContext::get<ExprDereference>(ctx);
            ExprDereference::ExprDereference(pEVar18,source,pTVar14->subType,local_230);
            local_1f4 = 1;
            arguments_local._8_8_ = pEVar18;
          }
        }
      }
      else {
        local_1f0 = getType<TypeRef>(local_1c8->type);
        if (local_1f0 == (TypeRef *)0x0) {
          arguments_local._8_8_ = local_1c8;
          local_1f4 = 1;
        }
        else {
          pEVar18 = ExpressionContext::get<ExprDereference>(ctx);
          ExprDereference::ExprDereference(pEVar18,source,local_1f0->subType,local_1c8);
          local_1f4 = 1;
          arguments_local._8_8_ = pEVar18;
        }
      }
      SmallArray<ArgumentData,_4U>::~SmallArray((SmallArray<ArgumentData,_4U> *)local_180);
      if (local_1f4 != 0) {
        return (ExprBase *)arguments_local._8_8_;
      }
    }
    if (local_389 != false) {
      anon_unknown.dwarf_6f1cc::Stop
                (ctx,source,"ERROR: overloaded \'[]\' operator is not available");
    }
    pAVar10 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&ctx_local,0);
    pEVar11 = CreateCast(ctx,source,pAVar10->value,ctx->typeInt,false);
    node_00 = anon_unknown.dwarf_6f1cc::EvaluateExpression(ctx,source,pEVar11);
    pEVar12 = getType<ExprIntegerLiteral>(node_00);
    if ((pEVar12 != (ExprIntegerLiteral *)0x0) && (pEVar12->value < 0)) {
      anon_unknown.dwarf_6f1cc::Stop(ctx,source,"ERROR: array index cannot be negative");
    }
    pTVar19 = getType<TypeArray>((type->super_ExprBase).type);
    if (pTVar19 != (TypeArray *)0x0) {
      if ((pEVar12 != (ExprIntegerLiteral *)0x0) && (pTVar19->length <= pEVar12->value)) {
        anon_unknown.dwarf_6f1cc::Stop(ctx,source,"ERROR: array index out of bounds");
      }
      pEVar20 = ExpressionContext::get<ExprArrayIndex>(ctx);
      pTVar14 = ExpressionContext::GetReferenceType(ctx,pTVar19->subType);
      ExprArrayIndex::ExprArrayIndex
                (pEVar20,source,&pTVar14->super_TypeBase,(ExprBase *)refType,pEVar11);
      pEVar18 = ExpressionContext::get<ExprDereference>(ctx);
      ExprDereference::ExprDereference(pEVar18,source,pTVar19->subType,&pEVar20->super_ExprBase);
      return &pEVar18->super_ExprBase;
    }
    pTVar21 = getType<TypeUnsizedArray>((type->super_ExprBase).type);
    if (pTVar21 != (TypeUnsizedArray *)0x0) {
      pEVar20 = ExpressionContext::get<ExprArrayIndex>(ctx);
      pTVar14 = ExpressionContext::GetReferenceType(ctx,pTVar21->subType);
      ExprArrayIndex::ExprArrayIndex
                (pEVar20,source,&pTVar14->super_TypeBase,(ExprBase *)refType,pEVar11);
      pEVar18 = ExpressionContext::get<ExprDereference>(ctx);
      ExprDereference::ExprDereference(pEVar18,source,pTVar21->subType,&pEVar20->super_ExprBase);
      return &pEVar18->super_ExprBase;
    }
  }
  anon_unknown.dwarf_6f1cc::Stop
            (ctx,source,"ERROR: type \'%.*s\' is not an array",
             (ulong)(uint)((int)(((type->super_ExprBase).type)->name).end -
                          (int)(((type->super_ExprBase).type)->name).begin),
             (((type->super_ExprBase).type)->name).begin);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* CreateArrayIndex(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<ArgumentData> arguments)
{
	// Handle argument[x] expresion
	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(value))
	{
		if(TypeArgumentSet *argumentSet = getType<TypeArgumentSet>(type->value))
		{
			if(arguments.size() == 1)
			{
				if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, arguments[0].value)))
				{
					if(number->value < 0)
						Stop(ctx, source, "ERROR: argument index can't be negative");

					if(argumentSet->types.empty())
						Stop(ctx, source, "ERROR: function argument set is empty");

					if(number->value >= argumentSet->types.size())
						Stop(ctx, source, "ERROR: function arguemnt set '%.*s' has only %d argument(s)", FMT_ISTR(argumentSet->name), argumentSet->types.size());

					return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentSet->types[unsigned(number->value)]->type);
				}
				else
				{
					Stop(ctx, source, "ERROR: expression didn't evaluate to a constant number");
				}
			}
		}
	}

	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(isType<TypeUnsizedArray>(value->type))
			wrapped = value;
	}
	else if(isType<TypeUnsizedArray>(value->type))
	{
		wrapped = value; // Do not modify
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetErrorType(), value, new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()));

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(isType<TypeRef>(wrapped->type) || isType<TypeUnsizedArray>(value->type))
	{
		bool findOverload = arguments.empty() || arguments.size() > 1;

		for(unsigned i = 0; i < arguments.size(); i++)
		{
			if(arguments[i].name)
				findOverload = true;
		}

		TypePair typePair(wrapped->type, arguments.empty() ? NULL : arguments[0].type);

		if(findOverload || !ctx.noIndexOperatorForTypePair.contains(typePair))
		{
			SmallArray<ArgumentData, 4> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(wrapped->source, false, NULL, wrapped->type, wrapped));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, true, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			callArguments[0] = ArgumentData(value->source, false, NULL, value->type, value);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, !findOverload, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			ctx.noIndexOperatorForTypePair.insert(typePair);
		}

		if(findOverload)
			Stop(ctx, source, "ERROR: overloaded '[]' operator is not available");

		ExprBase *index = CreateCast(ctx, source, arguments[0].value, ctx.typeInt, false);

		ExprIntegerLiteral *indexValue = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, index));

		if(indexValue && indexValue->value < 0)
			Stop(ctx, source, "ERROR: array index cannot be negative");

		if(TypeArray *type = getType<TypeArray>(value->type))
		{
			if(indexValue && indexValue->value >= type->length)
				Stop(ctx, source, "ERROR: array index out of bounds");

			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}

		if(TypeUnsizedArray *type = getType<TypeUnsizedArray>(value->type))
		{
			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}
	}

	Stop(ctx, source, "ERROR: type '%.*s' is not an array", FMT_ISTR(value->type->name));

	return NULL;
}